

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hdwallet.cpp
# Opt level: O3

void __thiscall HDWallet_ConvertTest_Test::TestBody(HDWallet_ConvertTest_Test *this)

{
  pointer puVar1;
  bool bVar2;
  internal iVar3;
  pointer __x;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  Bip39TestVector test_vector;
  AssertHelper local_1d0;
  string local_1c8;
  byte local_199;
  pointer local_198;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_190;
  pointer local_188;
  AssertHelper local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  ByteData local_158;
  ByteData local_138;
  HDWallet local_118;
  HDWallet local_f8;
  ByteData local_d8;
  pointer local_b8;
  ByteData local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  ByteData local_80;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  cfd::core::ByteData::ByteData(&local_d8);
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::ByteData::ByteData(&local_158);
  cfd::core::HDWallet::HDWallet(&local_f8);
  cfd::core::HDWallet::HDWallet(&local_118);
  cfd::core::ByteData::ByteData(&local_138);
  local_b8 = bip39_test_vectors.
             super__Vector_base<Bip39TestVector,_std::allocator<Bip39TestVector>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (bip39_test_vectors.super__Vector_base<Bip39TestVector,_std::allocator<Bip39TestVector>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      bip39_test_vectors.super__Vector_base<Bip39TestVector,_std::allocator<Bip39TestVector>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __x = bip39_test_vectors.super__Vector_base<Bip39TestVector,_std::allocator<Bip39TestVector>_>.
          _M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_b0.data_,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_98,&__x->mnemonic);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_80.data_,&(__x->seed).data_);
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,&local_98);
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_68,test_passphrase_abi_cxx11_._M_dataplus._M_p,
                     test_passphrase_abi_cxx11_._M_dataplus._M_p +
                     test_passphrase_abi_cxx11_._M_string_length);
          cfd::core::HDWallet::HDWallet((HDWallet *)&local_1c8,&local_48,&local_68,false);
          puVar1 = local_f8.seed_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_f8.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8._M_dataplus._M_p;
          local_f8.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1c8._M_string_length;
          local_f8.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_1c8.field_2._M_allocated_capacity;
          local_1c8._M_dataplus._M_p = (pointer)0x0;
          local_1c8._M_string_length = 0;
          local_1c8.field_2._M_allocated_capacity = 0;
          if ((long *)puVar1 != (long *)0x0) {
            operator_delete(puVar1);
            if ((long *)local_1c8._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_1c8._M_dataplus._M_p);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
        }
      }
      else {
        testing::Message::Message((Message *)&local_1c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_198,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xc0,
                   "Expected: hd_wallet = HDWallet(test_vector.mnemonic, test_passphrase) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_1c8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
        if ((long *)local_1c8._M_dataplus._M_p != (long *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && ((long *)local_1c8._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_1c8._M_dataplus._M_p + 8))();
          }
        }
      }
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          cfd::core::HDWallet::GetSeed((ByteData *)&local_1c8,&local_f8);
          puVar1 = local_158.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_158.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1c8._M_dataplus._M_p;
          local_158.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_1c8._M_string_length;
          local_158.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_1c8.field_2._M_allocated_capacity;
          local_1c8._M_dataplus._M_p = (pointer)0x0;
          local_1c8._M_string_length = 0;
          local_1c8.field_2._M_allocated_capacity = 0;
          if ((long *)puVar1 != (long *)0x0) {
            operator_delete(puVar1);
            if ((long *)local_1c8._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_1c8._M_dataplus._M_p);
            }
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_1c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_198,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xc1,
                   "Expected: actual_seed = hd_wallet.GetSeed() doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_1c8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
        if ((long *)local_1c8._M_dataplus._M_p != (long *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && ((long *)local_1c8._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_1c8._M_dataplus._M_p + 8))();
          }
        }
      }
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          cfd::core::HDWallet::ConvertMnemonicToEntropy
                    ((ByteData *)&local_1c8,&local_98,&language_abi_cxx11_);
          puVar1 = local_d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1c8._M_dataplus._M_p;
          local_d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_1c8._M_string_length;
          local_d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_1c8.field_2._M_allocated_capacity;
          local_1c8._M_dataplus._M_p = (pointer)0x0;
          local_1c8._M_string_length = 0;
          local_1c8.field_2._M_allocated_capacity = 0;
          if ((long *)puVar1 != (long *)0x0) {
            operator_delete(puVar1);
            if ((long *)local_1c8._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_1c8._M_dataplus._M_p);
            }
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_1c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_198,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xc2,
                   "Expected: actual_entropy = HDWallet::ConvertMnemonicToEntropy(test_vector.mnemonic, language) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_1c8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
        if ((long *)local_1c8._M_dataplus._M_p != (long *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && ((long *)local_1c8._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_1c8._M_dataplus._M_p + 8))();
          }
        }
      }
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          cfd::core::HDWallet::ConvertEntropyToMnemonic
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_198,&local_b0,&language_abi_cxx11_);
          local_1c8.field_2._M_allocated_capacity =
               (size_type)
               local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_1c8._M_string_length =
               (size_type)
               local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_1c8._M_dataplus._M_p =
               (pointer)local_178.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_188;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = local_198;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = sStack_190.ptr_;
          local_198 = (pointer)0x0;
          sStack_190.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
          ;
          local_188 = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1c8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_198);
        }
      }
      else {
        testing::Message::Message((Message *)&local_1c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_198,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xc3,
                   "Expected: actual_mnemonic = HDWallet::ConvertEntropyToMnemonic(test_vector.entropy, language) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_1c8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
        if ((long *)local_1c8._M_dataplus._M_p != (long *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && ((long *)local_1c8._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_1c8._M_dataplus._M_p + 8))();
          }
        }
      }
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          local_199 = cfd::core::HDWallet::CheckValidMnemonic(&local_98,&language_abi_cxx11_);
        }
      }
      else {
        testing::Message::Message((Message *)&local_1c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_198,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xc4,
                   "Expected: actual_is_valid = HDWallet::CheckValidMnemonic(test_vector.mnemonic, language) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_1c8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
        if ((long *)local_1c8._M_dataplus._M_p != (long *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && ((long *)local_1c8._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_1c8._M_dataplus._M_p + 8))();
          }
        }
      }
      bVar2 = cfd::core::ByteData::Equals(&local_d8,&local_b0);
      local_198 = (pointer)CONCAT71(local_198._1_7_,bVar2);
      sStack_190.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar2) {
        testing::Message::Message((Message *)&local_1d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1c8,(internal *)&local_198,
                   (AssertionResult *)"actual_entropy.Equals(test_vector.entropy)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xc5,local_1c8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_1d0);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        if (local_1d0.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_1d0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_1d0.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_190,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::
      CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((internal *)&local_1c8,"actual_mnemonic","test_vector.mnemonic",&local_178,
                 &local_98);
      if ((char)local_1c8._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_198);
        message = "";
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_1c8._M_string_length !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((_Alloc_hider *)local_1c8._M_string_length)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xc6,message);
        testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_198);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        if (local_198 != (pointer)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_198 != (pointer)0x0)) {
            (**(code **)(*(long *)local_198 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_1c8._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar3 = (internal)cfd::core::ByteData::Equals(&local_158,&local_80);
      sStack_190.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_198._0_1_ = iVar3;
      if (!(bool)iVar3) {
        testing::Message::Message((Message *)&local_1d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1c8,(internal *)&local_198,
                   (AssertionResult *)"actual_seed.Equals(test_vector.seed)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,199,local_1c8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_1d0);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        if (local_1d0.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_1d0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_1d0.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_190,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_198 = (pointer)CONCAT71(local_198._1_7_,local_199);
      sStack_190.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((local_199 & 1) == 0) {
        testing::Message::Message((Message *)&local_1d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1c8,(internal *)&local_198,(AssertionResult *)"actual_is_valid","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,200,local_1c8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_1d0);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        if (local_1d0.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_1d0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_1d0.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_190,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      cfd::core::HDWallet::HDWallet((HDWallet *)&local_1c8,&local_158);
      puVar1 = local_118.seed_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_118.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8._M_dataplus._M_p;
      local_118.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_1c8._M_string_length;
      local_118.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_1c8.field_2._M_allocated_capacity;
      local_1c8._M_dataplus._M_p = (pointer)0x0;
      local_1c8._M_string_length = 0;
      local_1c8.field_2._M_allocated_capacity = 0;
      if ((long *)puVar1 != (long *)0x0) {
        operator_delete(puVar1);
        if ((long *)local_1c8._M_dataplus._M_p != (long *)0x0) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
      }
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          cfd::core::HDWallet::GetSeed((ByteData *)&local_1c8,&local_118);
          puVar1 = local_138.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_138.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1c8._M_dataplus._M_p;
          local_138.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_1c8._M_string_length;
          local_138.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_1c8.field_2._M_allocated_capacity;
          local_1c8._M_dataplus._M_p = (pointer)0x0;
          local_1c8._M_string_length = 0;
          local_1c8.field_2._M_allocated_capacity = 0;
          if ((long *)puVar1 != (long *)0x0) {
            operator_delete(puVar1);
            if ((long *)local_1c8._M_dataplus._M_p != (long *)0x0) {
              operator_delete(local_1c8._M_dataplus._M_p);
            }
          }
        }
      }
      else {
        testing::Message::Message((Message *)&local_1c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_198,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xcb,
                   "Expected: copy_seed = copy_wallet.GetSeed() doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_1c8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
        if ((long *)local_1c8._M_dataplus._M_p != (long *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && ((long *)local_1c8._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_1c8._M_dataplus._M_p + 8))();
          }
        }
      }
      bVar2 = cfd::core::ByteData::Equals(&local_138,&local_80);
      local_198 = (pointer)CONCAT71(local_198._1_7_,bVar2);
      sStack_190.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar2) {
        testing::Message::Message((Message *)&local_1d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_1c8,(internal *)&local_198,
                   (AssertionResult *)"copy_seed.Equals(test_vector.seed)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_hdwallet.cpp"
                   ,0xcc,local_1c8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_1d0);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        if (local_1d0.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_1d0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_1d0.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_190,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      if (local_b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      __x = __x + 1;
    } while (__x != local_b8);
  }
  if ((long *)local_138.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_138.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((long *)local_118.seed_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_118.seed_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((long *)local_f8.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_f8.seed_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((long *)local_158.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_158.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178);
  if ((long *)local_d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(HDWallet, ConvertTest) {
  ByteData actual_entropy;
  std::vector<std::string> actual_mnemonic;
  ByteData actual_seed;
  bool actual_is_valid;
  HDWallet hd_wallet;

  HDWallet copy_wallet;
  ByteData copy_seed;
  for (Bip39TestVector test_vector : bip39_test_vectors) {
    EXPECT_NO_THROW(hd_wallet = HDWallet(test_vector.mnemonic, test_passphrase));
    EXPECT_NO_THROW(actual_seed = hd_wallet.GetSeed());
    EXPECT_NO_THROW(actual_entropy = HDWallet::ConvertMnemonicToEntropy(test_vector.mnemonic, language));
    EXPECT_NO_THROW(actual_mnemonic = HDWallet::ConvertEntropyToMnemonic(test_vector.entropy, language));
    EXPECT_NO_THROW(actual_is_valid = HDWallet::CheckValidMnemonic(test_vector.mnemonic, language));
    EXPECT_TRUE(actual_entropy.Equals(test_vector.entropy));
    EXPECT_EQ(actual_mnemonic, test_vector.mnemonic);
    EXPECT_TRUE(actual_seed.Equals(test_vector.seed));
    EXPECT_TRUE(actual_is_valid);

    copy_wallet = HDWallet(actual_seed);
    EXPECT_NO_THROW(copy_seed = copy_wallet.GetSeed());
    EXPECT_TRUE(copy_seed.Equals(test_vector.seed));
  }
}